

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O2

boolean put_lregion_here(level *lev,xchar x,xchar y,xchar nlx,xchar nly,xchar nhx,xchar nhy,
                        xchar rtype,boolean oneshot,d_level *dest_lvl)

{
  monst *mtmp;
  boolean bVar1;
  trap *trap;
  branch *br;
  byte bVar2;
  
  bVar1 = bad_location(lev,x,y,nlx,nly,nhx,nhy);
  if (bVar1 == '\0') {
LAB_001d2a0c:
    bVar1 = '\x01';
    switch(rtype) {
    case '\0':
    case '\x01':
      mkstairs(lev,x,y,rtype,(mkroom *)0x0);
      break;
    case '\x02':
      mkportal(lev,x,y,dest_lvl->dnum,dest_lvl->dlevel);
      break;
    case '\x03':
      br = Is_branchlev(&lev->z);
      place_branch(lev,br,x,y);
      break;
    case '\x04':
    case '\x05':
    case '\x06':
      mtmp = lev->monsters[x][y];
      if ((mtmp != (monst *)0x0) && ((mtmp->field_0x61 & 2) == 0)) {
        if (oneshot == '\0') goto LAB_001d2a04;
        rloc(lev,mtmp,'\0');
      }
      u_on_newpos((int)x,(int)y);
    }
  }
  else {
    if (oneshot != '\0') {
      trap = t_at(lev,(int)x,(int)y);
      if (((trap != (trap *)0x0) && (bVar2 = trap->field_0x8 & 0x1f, bVar2 != 0xf)) &&
         (bVar2 != 0x12)) {
        deltrap(lev,trap);
      }
      bVar1 = bad_location(lev,x,y,nlx,nly,nhx,nhy);
      if (bVar1 == '\0') goto LAB_001d2a0c;
    }
LAB_001d2a04:
    bVar1 = '\0';
  }
  return bVar1;
}

Assistant:

static boolean put_lregion_here(struct level *lev,
				xchar x, xchar y, xchar nlx, xchar nly,
				xchar nhx, xchar nhy, xchar rtype,
				boolean oneshot, d_level *dest_lvl)
{
    if (bad_location(lev, x, y, nlx, nly, nhx, nhy)) {
	if (!oneshot) {
	    return FALSE;		/* caller should try again */
	} else {
	    /* Must make do with the only location possible;
	       avoid failure due to a misplaced trap.
	       It might still fail if there's a dungeon feature here. */
	    struct trap *t = t_at(lev, x, y);

	    if (t && t->ttyp != MAGIC_PORTAL &&
                t->ttyp != VIBRATING_SQUARE) deltrap(lev, t);
	    if (bad_location(lev, x, y, nlx, nly, nhx, nhy)) return FALSE;
	}
    }
    switch (rtype) {
    case LR_TELE:
    case LR_UPTELE:
    case LR_DOWNTELE:
	/* "something" means the player in this case */
	if (MON_AT(lev, x, y)) {
	    /* move the monster if no choice, or just try again */
	    if (oneshot) rloc(lev, m_at(lev, x, y), FALSE);
	    else return FALSE;
	}
	u_on_newpos(x, y);
	break;
    case LR_PORTAL:
	mkportal(lev, x, y, dest_lvl->dnum, dest_lvl->dlevel);
	break;
    case LR_DOWNSTAIR:
    case LR_UPSTAIR:
	mkstairs(lev, x, y, (char)rtype, NULL);
	break;
    case LR_BRANCH:
	place_branch(lev, Is_branchlev(&lev->z), x, y);
	break;
    }
    return TRUE;
}